

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramStart(StreamingListener *this,UnitTest *param_1)

{
  allocator local_39;
  string local_38 [32];
  UnitTest *local_18;
  UnitTest *param_1_local;
  StreamingListener *this_local;
  
  local_18 = param_1;
  param_1_local = (UnitTest *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"event=TestProgramStart\n",&local_39);
  Send(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void OnTestProgramStart(const UnitTest& /* unit_test */) {
    Send("event=TestProgramStart\n");
  }